

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void highbd_transpose8x8_low_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *d0,__m128i *d1,__m128i *d2,__m128i *d3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  
  auVar1 = vpunpcklwd_avx((undefined1  [16])*x0,(undefined1  [16])*x1);
  auVar2 = vpunpcklwd_avx((undefined1  [16])*x2,(undefined1  [16])*x3);
  auVar3 = vpunpcklwd_avx((undefined1  [16])*x4,(undefined1  [16])*x5);
  auVar4 = vpunpcklwd_avx((undefined1  [16])*x6,(undefined1  [16])*x7);
  auVar5 = vpunpckldq_avx(auVar1,auVar2);
  auVar6 = vpunpckldq_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpcklqdq_avx(auVar5,auVar6);
  *d0 = alVar7;
  alVar7 = (__m128i)vpunpckhqdq_avx(auVar5,auVar6);
  *d1 = alVar7;
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpcklqdq_avx(auVar1,auVar2);
  *d2 = alVar7;
  alVar7 = (__m128i)vpunpckhqdq_avx(auVar1,auVar2);
  *d3 = alVar7;
  return;
}

Assistant:

static inline void highbd_transpose8x8_low_sse2(__m128i *x0, __m128i *x1,
                                                __m128i *x2, __m128i *x3,
                                                __m128i *x4, __m128i *x5,
                                                __m128i *x6, __m128i *x7,
                                                __m128i *d0, __m128i *d1,
                                                __m128i *d2, __m128i *d3) {
  __m128i w0, w1, w2, w3, ww0, ww1;
  // x0 00 01 02 03 04 05 06 07
  // x1 10 11 12 13 14 15 16 17
  // x2 20 21 22 23 24 25 26 27
  // x3 30 31 32 33 34 35 36 37
  // x4 40 41 42 43 44 45 46 47
  // x5 50 51 52 53 54 55 56 57
  // x6 60 61 62 63 64 65 66 67
  // x7 70 71 72 73 74 75 76 77

  w0 = _mm_unpacklo_epi16(*x0, *x1);  // 00 10 01 11 02 12 03 13
  w1 = _mm_unpacklo_epi16(*x2, *x3);  // 20 30 21 31 22 32 23 33
  w2 = _mm_unpacklo_epi16(*x4, *x5);  // 40 50 41 51 42 52 43 53
  w3 = _mm_unpacklo_epi16(*x6, *x7);  // 60 70 61 71 62 72 63 73

  ww0 = _mm_unpacklo_epi32(w0, w1);  // 00 10 20 30 01 11 21 31
  ww1 = _mm_unpacklo_epi32(w2, w3);  // 40 50 60 70 41 51 61 71

  *d0 = _mm_unpacklo_epi64(ww0, ww1);  // 00 10 20 30 40 50 60 70
  *d1 = _mm_unpackhi_epi64(ww0, ww1);  // 01 11 21 31 41 51 61 71

  ww0 = _mm_unpackhi_epi32(w0, w1);  // 02 12 22 32 03 13 23 33
  ww1 = _mm_unpackhi_epi32(w2, w3);  // 42 52 62 72 43 53 63 73

  *d2 = _mm_unpacklo_epi64(ww0, ww1);  // 02 12 22 32 42 52 62 72
  *d3 = _mm_unpackhi_epi64(ww0, ww1);  // 03 13 23 33 43 53 63 73
}